

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_dratio_dnode0
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio,REF_DBL *d_ratio)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  REF_DBL *pRVar7;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  REF_DBL d_ratio1 [3];
  REF_DBL d_ratio0 [3];
  REF_DBL direction [3];
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_DBL m [6];
  REF_DBL d_r [3];
  REF_DBL local_198 [4];
  REF_DBL local_178 [4];
  double local_158;
  double local_150;
  double local_148;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  REF_DBL local_118 [4];
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  REF_DBL local_d8 [4];
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  REF_DBL local_78 [6];
  double adStack_48 [3];
  
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
      ((node1 < 0 || (ref_node->global[(uint)node0] < 0)))) || (ref_node->global[(uint)node1] < 0))
  {
    pcVar6 = "node invalid";
    uVar2 = 3;
    uVar4 = 0x5f0;
    uVar5 = 3;
LAB_0019a291:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_dratio_dnode0",uVar5,pcVar6);
  }
  else {
    pRVar7 = ref_node->real;
    local_128 = (double)(ulong)(uint)(node1 * 0xf);
    uVar2 = node0 * 0xf;
    local_158 = pRVar7[(long)local_128] - pRVar7[uVar2];
    local_150 = pRVar7[(long)local_128 + 1] - pRVar7[(ulong)uVar2 + 1];
    local_148 = pRVar7[(long)local_128 + 2] - pRVar7[(ulong)uVar2 + 2];
    dVar8 = local_148 * local_148 + local_158 * local_158 + local_150 * local_150;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar8 = dVar8 * 1e+20;
    if (dVar8 <= -dVar8) {
      dVar8 = -dVar8;
    }
    dVar9 = local_158;
    if (local_158 <= -local_158) {
      dVar9 = -local_158;
    }
    if (dVar9 < dVar8) {
      dVar9 = local_150;
      if (local_150 <= -local_150) {
        dVar9 = -local_150;
      }
      if (dVar9 < dVar8) {
        dVar9 = local_148;
        if (local_148 <= -local_148) {
          dVar9 = -local_148;
        }
        if (dVar9 < dVar8) {
          if (ref_node->ratio_method != 2) {
            pRVar7 = ref_node->real;
            lVar3 = 0;
            do {
              local_78[lVar3] = pRVar7[(int)((int)lVar3 + uVar2 + 3)];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 6);
            pRVar7 = local_178;
            uVar2 = ref_matrix_sqrt_vt_m_v_deriv(local_78,&local_158,&local_e0,pRVar7);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x60e,"ref_node_dratio_dnode0",(ulong)uVar2,"vt m v0");
              return uVar2;
            }
            lVar3 = 0;
            do {
              local_178[lVar3] = -local_178[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            pRVar1 = ref_node->real;
            lVar3 = 0;
            do {
              local_78[lVar3] = pRVar1[SUB84(local_128,0) + 3 + (int)lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 6);
            uVar2 = ref_matrix_sqrt_vt_m_v_deriv(local_78,&local_158,&local_e8,local_198);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x611,"ref_node_dratio_dnode0",(ulong)uVar2,"vt m v0");
              return uVar2;
            }
            lVar3 = 0;
            do {
              local_198[lVar3] = -local_198[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            if ((local_e0 < 1e-12) || (local_e8 < 1e-12)) {
              if (local_e8 <= local_e0) {
                *ratio = local_e8;
                *d_ratio = local_198[0];
                d_ratio[1] = local_198[1];
                local_178[2] = local_198[2];
              }
              else {
                *ratio = local_e0;
                *d_ratio = local_178[0];
                d_ratio[1] = local_178[1];
              }
              d_ratio[2] = local_178[2];
              return 0;
            }
            if (local_e8 <= local_e0) {
              local_118[0] = local_198[0];
              local_118[1] = local_198[1];
              uVar10 = SUB84(local_e0,0);
              uVar11 = (undefined4)((ulong)local_e0 >> 0x20);
              local_178[2] = local_198[2];
              local_b8 = local_e8;
            }
            else {
              local_118[0] = local_178[0];
              local_118[1] = local_178[1];
              uVar10 = SUB84(local_e8,0);
              uVar11 = (undefined4)((ulong)local_e8 >> 0x20);
              pRVar7 = local_198;
              local_b8 = local_e0;
            }
            local_118[2] = local_178[2];
            local_d8[0] = *pRVar7;
            local_d8[1] = pRVar7[1];
            local_d8[2] = pRVar7[2];
            lVar3 = 0;
            do {
              adStack_48[lVar3] =
                   ((local_118[lVar3] * (double)CONCAT44(uVar11,uVar10) +
                    local_d8[lVar3] * -local_b8) / (double)CONCAT44(uVar11,uVar10)) /
                   (double)CONCAT44(uVar11,uVar10);
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            local_138 = local_b8 / (double)CONCAT44(uVar11,uVar10);
            uStack_130 = 0;
            local_a8 = local_138 + -1.0;
            uStack_a0 = 0;
            dVar8 = local_a8;
            if (local_a8 <= -local_a8) {
              dVar8 = -local_a8;
            }
            if (1e-12 <= dVar8) {
              uStack_b0 = 0;
              local_f8 = log(local_138);
              local_f8 = local_f8 * local_138;
              *ratio = (local_b8 * local_a8) / local_f8;
              local_98 = local_138 / local_138;
              uStack_90 = uStack_130;
              local_88._8_4_ = (int)uStack_b0;
              local_88._0_8_ = -(local_b8 * local_a8);
              local_88._12_4_ = (uint)((ulong)uStack_b0 >> 0x20) ^ 0x80000000;
              lVar3 = 0;
              do {
                local_f0 = adStack_48[lVar3];
                local_128 = local_b8 * local_f0 + local_118[lVar3] * local_a8;
                uStack_120 = uStack_b0;
                dVar8 = log(local_138);
                d_ratio[lVar3] =
                     ((local_128 * local_f8 +
                      (local_f0 * local_98 + dVar8 * local_f0) * (double)local_88._0_8_) / local_f8)
                     / local_f8;
                lVar3 = lVar3 + 1;
              } while (lVar3 != 3);
              return 0;
            }
            *ratio = (local_e0 + local_e8) * 0.5;
            lVar3 = 0;
            do {
              d_ratio[lVar3] = (local_118[lVar3] + local_d8[lVar3]) * 0.5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            return 0;
          }
          uVar2 = ref_node_dratio_dnode0_quadrature(ref_node,node0,node1,ratio,d_ratio);
          if (uVar2 == 0) {
            return 0;
          }
          pcVar6 = "dratio quad";
          uVar4 = 0x609;
          uVar5 = (ulong)uVar2;
          goto LAB_0019a291;
        }
      }
    }
    uVar2 = 0;
    *ratio = 0.0;
    d_ratio[2] = 0.0;
    *d_ratio = 0.0;
    d_ratio[1] = 0.0;
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_dratio_dnode0(REF_NODE ref_node, REF_INT node0,
                                          REF_INT node1, REF_DBL *ratio,
                                          REF_DBL *d_ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, d_ratio0[3], ratio1, d_ratio1[3];
  REF_DBL r, d_r[3], r_min, d_r_min[3], r_max, d_r_max[3];
  REF_INT i;
  REF_DBL r_log_r;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    d_ratio[0] = 0.0;
    d_ratio[1] = 0.0;
    d_ratio[2] = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_dratio_dnode0_quadrature(ref_node, node0, node1, ratio,
                                          d_ratio),
        "dratio quad");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio0, d_ratio0), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio0[i] = -d_ratio0[i]; /* node 0 is neg */
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio1, d_ratio1), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio1[i] = -d_ratio1[i]; /* node 0 is neg */

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    if (ratio0 < ratio1) {
      *ratio = ratio0;
      d_ratio[0] = d_ratio0[0];
      d_ratio[1] = d_ratio0[1];
      d_ratio[2] = d_ratio0[2];
    } else {
      *ratio = ratio1;
      d_ratio[0] = d_ratio1[0];
      d_ratio[1] = d_ratio1[1];
      d_ratio[2] = d_ratio1[2];
    }
    return REF_SUCCESS;
  }

  if (ratio0 < ratio1) {
    r_min = ratio0;
    d_r_min[0] = d_ratio0[0];
    d_r_min[1] = d_ratio0[1];
    d_r_min[2] = d_ratio0[2];
    r_max = ratio1;
    d_r_max[0] = d_ratio1[0];
    d_r_max[1] = d_ratio1[1];
    d_r_max[2] = d_ratio1[2];
  } else {
    r_min = ratio1;
    d_r_min[0] = d_ratio1[0];
    d_r_min[1] = d_ratio1[1];
    d_r_min[2] = d_ratio1[2];
    r_max = ratio0;
    d_r_max[0] = d_ratio0[0];
    d_r_max[1] = d_ratio0[1];
    d_r_max[2] = d_ratio0[2];
  }

  r = r_min / r_max;
  for (i = 0; i < 3; i++)
    d_r[i] = (d_r_min[i] * r_max - r_min * d_r_max[i]) / r_max / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (r_min + r_max);
    for (i = 0; i < 3; i++) d_ratio[i] = 0.5 * (d_r_min[i] + d_r_max[i]);
    return REF_SUCCESS;
  }

  r_log_r = r * log(r);
  *ratio = r_min * (r - 1.0) / r_log_r;

  for (i = 0; i < 3; i++)
    d_ratio[i] = ((r_min * d_r[i] + d_r_min[i] * (r - 1.0)) * r_log_r -
                  r_min * (r - 1.0) * (r * 1 / r * d_r[i] + d_r[i] * log(r))) /
                 r_log_r / r_log_r;

  return REF_SUCCESS;
}